

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

int __thiscall cmsys::RegExpFind::regrepeat(RegExpFind *this,char *p)

{
  char *__s;
  size_t sVar1;
  char *pcVar2;
  char *__s_00;
  int iVar3;
  size_t sVar4;
  
  if ((byte)*p - 3 < 6) {
    __s = this->reginput;
    __s_00 = p + 3;
    switch((uint)(byte)*p) {
    case 3:
      sVar4 = strlen(__s);
      sVar1 = (long)(int)sVar4;
      break;
    case 4:
      sVar4 = 0;
      while ((sVar1 = sVar4, __s[sVar4] != '\0' &&
             (pcVar2 = strchr(__s_00,(int)__s[sVar4]), pcVar2 != (char *)0x0))) {
        sVar4 = sVar4 + 1;
      }
      break;
    case 5:
      sVar4 = 0;
      while ((sVar1 = sVar4, __s[sVar4] != '\0' &&
             (pcVar2 = strchr(__s_00,(int)__s[sVar4]), pcVar2 == (char *)0x0))) {
        sVar4 = sVar4 + 1;
      }
      break;
    default:
      goto switchD_00128ab0_caseD_6;
    case 8:
      for (sVar4 = 0; sVar1 = sVar4, *__s_00 == __s[sVar4]; sVar4 = sVar4 + 1) {
      }
    }
    iVar3 = (int)sVar4;
    this->reginput = __s + sVar1;
  }
  else {
switchD_00128ab0_caseD_6:
    puts("cm RegularExpression::find(): Internal error.");
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int RegExpFind::regrepeat(const char* p)
{
  int count = 0;
  const char* scan;
  const char* opnd;

  scan = reginput;
  opnd = OPERAND(p);
  switch (OP(p)) {
    case ANY:
      count = int(strlen(scan));
      scan += count;
      break;
    case EXACTLY:
      while (*opnd == *scan) {
        count++;
        scan++;
      }
      break;
    case ANYOF:
      while (*scan != '\0' && strchr(opnd, *scan) != nullptr) {
        count++;
        scan++;
      }
      break;
    case ANYBUT:
      while (*scan != '\0' && strchr(opnd, *scan) == nullptr) {
        count++;
        scan++;
      }
      break;
    default: // Oh dear.  Called inappropriately.
      // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
      printf("cm RegularExpression::find(): Internal error.\n");
      return 0;
  }
  reginput = scan;
  return (count);
}